

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signmessage.cpp
# Opt level: O0

bool MessageSign(CKey *privkey,string *message,string *signature)

{
  long lVar1;
  Span<const_unsigned_char> input;
  bool bVar2;
  string *in_RDI;
  long in_FS_OFFSET;
  byte bVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature_bytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  uint256 *in_stack_ffffffffffffff90;
  CKey *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff48);
  MessageHash(in_RDI);
  bVar2 = CKey::SignCompact(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  bVar3 = ((bVar2 ^ 0xffU) & 1) == 0;
  if ((bool)bVar3) {
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_RDI,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
               in_stack_ffffffffffffff48);
    input.m_size = (size_t)in_stack_ffffffffffffffa8;
    input.m_data = (uchar *)in_stack_ffffffffffffffa0;
    EncodeBase64_abi_cxx11_(input);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::__cxx11::string::~string(in_stack_ffffffffffffff48);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool MessageSign(
    const CKey& privkey,
    const std::string& message,
    std::string& signature)
{
    std::vector<unsigned char> signature_bytes;

    if (!privkey.SignCompact(MessageHash(message), signature_bytes)) {
        return false;
    }

    signature = EncodeBase64(signature_bytes);

    return true;
}